

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::MinTypMaxExpression>
          (PropagationVisitor *this,MinTypMaxExpression *expr)

{
  Type *pTVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Expression *pEVar5;
  SourceLocation loc;
  
  bVar2 = bad(&expr->super_Expression);
  if (bVar2) {
    return &expr->super_Expression;
  }
  pTVar1 = this->newType;
  pTVar4 = pTVar1->canonical;
  if (pTVar4 == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
    pTVar4 = pTVar1->canonical;
  }
  if ((pTVar4->super_Symbol).kind == ErrorType) {
    if (this->newType != (Type *)0x0) {
      (expr->super_Expression).type.ptr = this->newType;
      return &expr->super_Expression;
    }
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x1b,
               "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
              );
  }
  pTVar1 = (expr->super_Expression).type.ptr;
  if (pTVar1 == (Type *)0x0) goto LAB_00273926;
  bVar2 = Type::isEquivalent(this->newType,pTVar1);
  pTVar1 = this->newType;
  pTVar4 = pTVar1->canonical;
  if (pTVar4 == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
    pTVar4 = pTVar1->canonical;
  }
  if ((pTVar4->super_Symbol).kind == FloatingType) {
    pTVar1 = (expr->super_Expression).type.ptr;
    if (pTVar1 == (Type *)0x0) goto LAB_00273926;
    pTVar4 = pTVar1->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
      pTVar4 = pTVar1->canonical;
    }
    if ((pTVar4->super_Symbol).kind != FloatingType) goto LAB_00273886;
  }
  else {
LAB_00273886:
    bVar3 = Type::isIntegral(this->newType);
    if (bVar3) {
      pTVar1 = (expr->super_Expression).type.ptr;
      if (pTVar1 == (Type *)0x0) {
LAB_00273926:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                  );
      }
      bVar3 = Type::isIntegral(pTVar1);
      if (bVar3) goto LAB_002738e9;
    }
    pTVar1 = this->newType;
    pTVar4 = pTVar1->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
      pTVar4 = pTVar1->canonical;
    }
    if (((pTVar4->super_Symbol).kind != StringType) && ((expr->super_Expression).kind != OpenRange))
    {
      if (bVar2) {
        return &expr->super_Expression;
      }
      goto LAB_002738d1;
    }
  }
LAB_002738e9:
  bVar3 = MinTypMaxExpression::propagateType(expr,this->context,this->newType);
  if (bVar2 || bVar3) {
    return &expr->super_Expression;
  }
LAB_002738d1:
  loc = this->assignmentLoc;
  bVar2 = ((ulong)loc & 0xfffffff) == 0;
  if (bVar2) {
    loc = (expr->super_Expression).sourceRange.startLoc;
  }
  pEVar5 = ConversionExpression::makeImplicit
                     (this->context,this->newType,(uint)bVar2,&expr->super_Expression,loc);
  return pEVar5;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (is_detected_v<propagate_t, T, const ASTContext&, const Type&>) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::OpenRange) {

                if (expr.propagateType(context, newType))
                    needConversion = false;
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            if (assignmentLoc) {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Implicit, expr,
                                                             assignmentLoc);
            }
            else {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Propagated, expr,
                                                             expr.sourceRange.start());
            }
        }

        return *result;
    }